

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O2

char * gravity_object_debug(gravity_object_t *obj,_Bool is_free)

{
  uint32_t uVar1;
  gravity_class_t *pgVar2;
  char *__format;
  gravity_class_t *pgVar3;
  char *pcVar4;
  
  pcVar4 = "";
  if ((obj != (gravity_object_t *)0x0) && (pgVar3 = obj->isa, pgVar3 != (gravity_class_t *)0x0)) {
    if (pgVar3 == gravity_class_int) {
      pcVar4 = "INT";
    }
    else if (pgVar3 == gravity_class_float) {
      pcVar4 = "FLOAT";
    }
    else if (pgVar3 == gravity_class_bool) {
      pcVar4 = "BOOL";
    }
    else if (pgVar3 == gravity_class_null) {
      pcVar4 = "NULL";
    }
    else {
      if (pgVar3 == gravity_class_function) {
        pgVar3 = (gravity_class_t *)"ANONYMOUS";
        if ((gravity_class_t *)obj->identifier != (gravity_class_t *)0x0) {
          pgVar3 = (gravity_class_t *)obj->identifier;
        }
        __format = "FUNCTION %p %s";
      }
      else if (pgVar3 == gravity_class_closure) {
        if (is_free) {
          pgVar2 = (gravity_class_t *)0x0;
        }
        else {
          pgVar2 = *(gravity_class_t **)(obj->identifier + 0x38);
        }
        pgVar3 = (gravity_class_t *)"ANONYMOUS";
        if (pgVar2 != (gravity_class_t *)0x0) {
          pgVar3 = pgVar2;
        }
        __format = "CLOSURE %p %s";
      }
      else if (pgVar3 == gravity_class_class) {
        pgVar3 = (gravity_class_t *)"ANONYMOUS";
        if ((gravity_class_t *)obj->identifier != (gravity_class_t *)0x0) {
          pgVar3 = (gravity_class_t *)obj->identifier;
        }
        __format = "CLASS %p %s";
      }
      else if (pgVar3 == gravity_class_string) {
        pgVar3 = obj->objclass;
        __format = "STRING %p %s";
      }
      else if (pgVar3 == gravity_class_instance) {
        pgVar3 = (gravity_class_t *)"ANONYMOUS";
        if ((!is_free) && (obj->objclass != (gravity_class_t *)0x0)) {
          pgVar2 = (gravity_class_t *)obj->objclass->identifier;
          pgVar3 = (gravity_class_t *)"ANONYMOUS";
          if (pgVar2 != (gravity_class_t *)0x0) {
            pgVar3 = pgVar2;
          }
        }
        __format = "INSTANCE %p OF %s";
      }
      else {
        if (pgVar3 == gravity_class_range) {
          snprintf(gravity_object_debug::buffer,0x200,"RANGE %p %ld %ld",obj,obj->objclass,
                   obj->identifier);
          return gravity_object_debug::buffer;
        }
        if (pgVar3 == gravity_class_list) {
          pgVar3 = obj->objclass;
          __format = "LIST %p (%ld items)";
        }
        else {
          if (pgVar3 != gravity_class_map) {
            if (pgVar3 == gravity_class_fiber) {
              pcVar4 = "FIBER %p";
            }
            else {
              if (pgVar3 != gravity_class_upvalue) {
                return "N/A";
              }
              pcVar4 = "UPVALUE %p";
            }
            snprintf(gravity_object_debug::buffer,0x200,pcVar4,obj);
            return gravity_object_debug::buffer;
          }
          uVar1 = gravity_hash_count((gravity_hash_t *)obj->objclass);
          pgVar3 = (gravity_class_t *)(ulong)uVar1;
          __format = "MAP %p (%ld items)";
        }
      }
      pcVar4 = gravity_object_debug::buffer;
      snprintf(gravity_object_debug::buffer,0x200,__format,obj,pgVar3);
    }
  }
  return pcVar4;
}

Assistant:

const char *gravity_object_debug (gravity_object_t *obj, bool is_free) {
    if ((!obj) || (!OBJECT_IS_VALID(obj))) return "";

    if (OBJECT_ISA_INT(obj)) return "INT";
    if (OBJECT_ISA_FLOAT(obj)) return "FLOAT";
    if (OBJECT_ISA_BOOL(obj)) return "BOOL";
    if (OBJECT_ISA_NULL(obj)) return "NULL";

    static char buffer[512];
    if (OBJECT_ISA_FUNCTION(obj)) {
        const char *name = ((gravity_function_t*)obj)->identifier;
        if (!name) name = "ANONYMOUS";
        snprintf(buffer, sizeof(buffer), "FUNCTION %p %s", obj, name);
        return buffer;
    }

    if (OBJECT_ISA_CLOSURE(obj)) {
        // cannot guarantee ptr validity during a free
        const char *name = (is_free) ? NULL : ((gravity_closure_t*)obj)->f->identifier;
        if (!name) name = "ANONYMOUS";
        snprintf(buffer, sizeof(buffer), "CLOSURE %p %s", obj, name);
        return buffer;
    }

    if (OBJECT_ISA_CLASS(obj)) {
        const char *name = ((gravity_class_t*)obj)->identifier;
        if (!name) name = "ANONYMOUS";
        snprintf(buffer, sizeof(buffer), "CLASS %p %s", obj, name);
        return buffer;
    }

    if (OBJECT_ISA_STRING(obj)) {
        snprintf(buffer, sizeof(buffer), "STRING %p %s", obj, ((gravity_string_t*)obj)->s);
        return buffer;
    }

    if (OBJECT_ISA_INSTANCE(obj)) {
        // cannot guarantee ptr validity during a free
        gravity_class_t *c = (is_free) ? NULL : ((gravity_instance_t*)obj)->objclass;
        const char *name = (c && c->identifier) ? c->identifier : "ANONYMOUS";
        snprintf(buffer, sizeof(buffer), "INSTANCE %p OF %s", obj, name);
        return buffer;
    }

    if (OBJECT_ISA_RANGE(obj)) {
        snprintf(buffer, sizeof(buffer), "RANGE %p %ld %ld", obj, (long)((gravity_range_t*)obj)->from, (long)((gravity_range_t*)obj)->to);
        return buffer;
    }

    if (OBJECT_ISA_LIST(obj)) {
        snprintf(buffer, sizeof(buffer), "LIST %p (%ld items)", obj, (long)marray_size(((gravity_list_t*)obj)->array));
        return buffer;
    }

    if (OBJECT_ISA_MAP(obj)) {
         snprintf(buffer, sizeof(buffer), "MAP %p (%ld items)", obj, (long)gravity_hash_count(((gravity_map_t*)obj)->hash));
         return buffer;
    }

    if (OBJECT_ISA_FIBER(obj)) {
        snprintf(buffer, sizeof(buffer), "FIBER %p", obj);
        return buffer;
    }

    if (OBJECT_ISA_UPVALUE(obj)) {
        snprintf(buffer, sizeof(buffer), "UPVALUE %p", obj);
        return buffer;
    }

    return "N/A";
}